

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

int tcu::anon_unknown_74::convertSatRte<int>(float f)

{
  long lVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = floorf(f);
  fVar3 = f - fVar3;
  lVar1 = (long)(f - fVar3);
  if ((fVar3 != 0.5) || (NAN(fVar3))) {
    if (0.5 < fVar3) {
      lVar1 = lVar1 + 1;
    }
  }
  else {
    lVar1 = lVar1 + (ulong)((uint)lVar1 & 1);
  }
  lVar2 = 0x7fffffff;
  if (lVar1 < 0x7fffffff) {
    lVar2 = lVar1;
  }
  lVar1 = -0x80000000;
  if (-0x80000000 < lVar2) {
    lVar1 = lVar2;
  }
  return (int)lVar1;
}

Assistant:

inline T convertSatRte (float f)
{
	// \note Doesn't work for 64-bit types
	DE_STATIC_ASSERT(sizeof(T) < sizeof(deUint64));
	DE_STATIC_ASSERT((-3 % 2 != 0) && (-4 % 2 == 0));

	deInt64	minVal	= std::numeric_limits<T>::min();
	deInt64 maxVal	= std::numeric_limits<T>::max();
	float	q		= deFloatFrac(f);
	deInt64 intVal	= (deInt64)(f-q);

	// Rounding.
	if (q == 0.5f)
	{
		if (intVal % 2 != 0)
			intVal++;
	}
	else if (q > 0.5f)
		intVal++;
	// else Don't add anything

	// Saturate.
	intVal = de::max(minVal, de::min(maxVal, intVal));

	return (T)intVal;
}